

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

void soul::throwInternalCompilerError(char *message,char *location,int line)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  size_type *psVar4;
  long *plVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  string __str;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_50,message,&local_111);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x258626);
  local_110._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
    local_110.field_2._M_allocated_capacity = *psVar4;
    local_110.field_2._8_8_ = plVar2[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar4;
  }
  local_110._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_b0 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_b0 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_70 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_70 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_d0 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar4) {
    local_f0.field_2._M_allocated_capacity = *psVar4;
    local_f0.field_2._8_8_ = plVar2[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar4;
  }
  local_f0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __val = -line;
  if (0 < line) {
    __val = line;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar6;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001b04be;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001b04be;
      }
      if (uVar3 < 10000) goto LAB_001b04be;
      uVar6 = uVar6 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_001b04be:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(line >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p + ((uint)line >> 0x1f),__len,__val);
  std::operator+(&local_110,&local_f0,&local_90);
  throwInternalCompilerError(&local_110);
}

Assistant:

[[noreturn]] void throwInternalCompilerError (const char* message, const char* location, int line)
{
    throwInternalCompilerError (choc::text::addDoubleQuotes (message) + " failed at " + location + ":" + std::to_string (line));
}